

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashset.cpp
# Opt level: O3

void lsvm::hashset::put(hashset *h,void *val)

{
  uint uVar1;
  equals_fp p_Var2;
  undefined1 auVar3 [16];
  bool bVar4;
  uint uVar5;
  uint uVar6;
  hash keyhash;
  uint uVar7;
  ulong uVar8;
  equals_fp p_Var9;
  equals_fp p_Var10;
  uint uVar11;
  uint16_t local_38;
  
  keyhash = (*h->hash)(val);
  uVar5 = (uint)h->bits & (uint)keyhash;
  p_Var2 = (&h[1].equals)[uVar5];
  do {
    if (p_Var2 == (equals_fp)0x0) {
      local_38 = (uint16_t)uVar5;
      insert_into_partition(h,keyhash,local_38,val,true);
      return;
    }
    uVar1 = (&primes)[*(uint *)(p_Var2 + 0xc)];
    auVar3._8_8_ = 0;
    auVar3._0_8_ = keyhash;
    uVar8 = SUB168(auVar3 % ZEXT416(uVar1),0);
    p_Var9 = p_Var2 + (uVar8 * 2 + 2) * 8;
    uVar6 = uVar1 - 1;
    uVar7 = (h->range * uVar1) / 100000;
    if (uVar1 <= uVar7) {
      uVar7 = uVar6;
    }
    uVar11 = uVar7 + SUB164(auVar3 % ZEXT416(uVar1),0);
    if (uVar11 < uVar1) {
      p_Var10 = p_Var9 + (ulong)uVar7 * 0x10;
      do {
        if (((*(hash *)p_Var9 == keyhash) && (*(void **)(p_Var9 + 8) != (void *)0x0)) &&
           (bVar4 = (*h->equals)(val,*(void **)(p_Var9 + 8)), bVar4)) {
          *(void **)(p_Var9 + 8) = val;
          return;
        }
        p_Var9 = p_Var9 + 0x10;
      } while (p_Var9 <= p_Var10);
    }
    else {
      p_Var10 = p_Var2 + 0x10;
      if (uVar8 <= uVar6) {
        do {
          if (((*(hash *)p_Var9 == keyhash) && (*(void **)(p_Var9 + 8) != (void *)0x0)) &&
             (bVar4 = (*h->equals)(val,*(void **)(p_Var9 + 8)), bVar4)) {
            *(void **)(p_Var9 + 8) = val;
            return;
          }
          p_Var9 = p_Var9 + 0x10;
        } while (p_Var9 <= p_Var10 + (ulong)uVar6 * 0x10);
      }
      do {
        if (((*(hash *)p_Var10 == keyhash) && (*(void **)(p_Var10 + 8) != (void *)0x0)) &&
           (bVar4 = (*h->equals)(val,*(void **)(p_Var10 + 8)), bVar4)) {
          *(void **)(p_Var10 + 8) = val;
          return;
        }
        p_Var10 = p_Var10 + 0x10;
      } while (p_Var10 <= p_Var2 + ((ulong)(uVar11 - uVar1) * 2 + 2) * 8);
    }
    p_Var2 = *(equals_fp *)p_Var2;
  } while( true );
}

Assistant:

void put(hashset* h, void* val){
    // calculate hash for a key
    hash keyhash = h->hash(val);
    // calculate bit for a hash
    uint16_t bit = hashbit(keyhash,h->bits);
    // get bit partition bucket
    hashbucket* bp = *partition(h,bit);

    // find key in a bucket using open address and replace it's value
    while(bp != null){
        uint32_t range = entry_range(h,bp);
        uint32_t index = entry_index(bp,keyhash);
        entry* he = get_entry(bp,index);
        const uint32_t bs = bucket_size(bp);
        if(range >= bs) range = bs-1;
        if((index+range) >= bs){
            entry* ehe = get_entry(bp,bs-1);
            while(he <= ehe){
                if(he->valhash == keyhash && he->val != null && h->equals(val,he->val)){
                    he->val = val;
                    return;
                }
                ++he;
            }
            range = (index+range) - bs;
            he = get_entry(bp,0);
            ehe = he+range;
            while(he <= ehe){
                if(he->valhash == keyhash && he->val != null && h->equals(val,he->val)){
                    he->val = val;
                    return;
                }
                ++he;
            }
        }else{
            entry* ehe = he + range;
            while(he <= ehe){
                if(he->valhash == keyhash && he->val != null && h->equals(val,he->val)){
                    he->val = val;
                    return;
                }
                ++he;
            }
        }
        bp = bp->next;    
    }

    // if key not found insert it into partition
    insert_into_partition(h,keyhash,bit,val,true);
}